

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Int_t * Pdr_InvMinimize(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  abctime aVar10;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  sat_solver *p_01;
  sat_solver *p_02;
  void *__s;
  abctime aVar11;
  Vec_Int_t *p_03;
  uint uVar12;
  uint *puVar13;
  int Fill;
  abctime time;
  size_t __size;
  int iVar14;
  char *pStr;
  sat_solver *psVar15;
  uint uVar16;
  int iVar17;
  uint *puVar18;
  int iVar19;
  uint i;
  ulong uVar20;
  long lVar21;
  uint local_98;
  
  aVar10 = Abc_Clock();
  __size = 0;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  puVar3 = (uint *)vInv->pArray;
  uVar9 = *puVar3;
  p_01 = (sat_solver *)Vec_IntAlloc(100);
  iVar14 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  p_02 = (sat_solver *)malloc(0x10);
  iVar19 = iVar14 * 0x20;
  p_02->size = iVar19;
  if (iVar14 == 0) {
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar14 << 2;
    __s = malloc(__size);
  }
  *(void **)&p_02->qhead = __s;
  p_02->cap = iVar19;
  memset(__s,0,__size);
  iVar14 = p_00->nVars;
  iVar1 = p->nRegs;
  iVar2 = p->vCos->nSize;
  iVar4 = sat_solver_nvars(s);
  iVar5 = sat_solver_nvars(s);
  if (iVar5 != p_00->nVars) {
    __assert_fail("sat_solver_nvars(pSat) == pCnf->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                  ,0x333,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
  }
  iVar5 = sat_solver_nvars(s);
  psVar15 = s;
  sat_solver_setnvars(s,iVar5 + uVar9);
  puVar13 = puVar3 + 1;
  puVar18 = puVar13;
  for (iVar5 = 0; uVar7 = *puVar3, iVar5 < (int)uVar7; iVar5 = iVar5 + 1) {
    iVar6 = Abc_Var2Lit(iVar5 + iVar4,1);
    Vec_IntFill((Vec_Int_t *)p_01,iVar6,Fill);
    for (lVar21 = 0; lVar21 < (int)*puVar18; lVar21 = lVar21 + 1) {
      iVar6 = Abc_Lit2Var(puVar18[lVar21 + 1]);
      uVar7 = Abc_LitIsCompl(puVar18[lVar21 + 1]);
      iVar6 = Abc_Var2Lit(iVar6 + (iVar14 - iVar1),uVar7 ^ 1);
      Vec_IntPush((Vec_Int_t *)p_01,iVar6);
    }
    psVar15 = s;
    iVar6 = sat_solver_addclause(s,*(lit **)&p_01->qhead,*(lit **)&p_01->qhead + p_01->cap);
    if (iVar6 != 1) {
      __assert_fail("status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                    ,0x33e,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
    }
    puVar18 = puVar18 + (long)(int)*puVar18 + 1;
  }
  uVar12 = 0;
  if (0 < (int)uVar9) {
    uVar12 = uVar9;
  }
  local_98 = 0;
  uVar20 = 0;
  while( true ) {
    iVar14 = (int)psVar15;
    i = (uint)uVar20;
    if ((int)uVar7 <= (int)i) break;
    psVar15 = p_02;
    iVar14 = Vec_BitEntry((Vec_Bit_t *)p_02,i);
    if (iVar14 == 0) {
      p_01->cap = 0;
      for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        if (i != uVar16) {
          psVar15 = p_02;
          iVar14 = Vec_BitEntry((Vec_Bit_t *)p_02,uVar16);
          if (iVar14 == 0) {
            iVar14 = Abc_Var2Lit(iVar4 + uVar16,0);
            psVar15 = p_01;
            Vec_IntPush((Vec_Int_t *)p_01,iVar14);
          }
        }
      }
      iVar5 = p_01->cap;
      iVar6 = 0;
      do {
        iVar17 = iVar6;
        iVar14 = p->vCos->nSize - p->nRegs;
        if (iVar14 <= iVar17) goto LAB_004dbfca;
        Vec_IntShrink((Vec_Int_t *)p_01,iVar5);
        iVar14 = Abc_Var2Lit(iVar17 + 1,0);
        Vec_IntPush((Vec_Int_t *)p_01,iVar14);
        psVar15 = s;
        iVar8 = sat_solver_solve(s,*(lit **)&p_01->qhead,*(lit **)&p_01->qhead + p_01->cap,0,0,0,0);
        iVar14 = (int)psVar15;
        iVar6 = iVar17 + 1;
      } while (iVar8 == -1);
      if (iVar8 == 0) break;
      if (iVar8 != 1) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x35a,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
      }
      iVar14 = p->vCos->nSize - p->nRegs;
LAB_004dbfca:
      if (iVar14 <= iVar17) {
        puVar18 = puVar13;
        for (uVar16 = 0; (int)uVar16 < (int)*puVar3; uVar16 = uVar16 + 1) {
          psVar15 = p_02;
          iVar14 = Vec_BitEntry((Vec_Bit_t *)p_02,uVar16);
          if ((uVar16 != i) && (iVar14 == 0)) {
            Vec_IntShrink((Vec_Int_t *)p_01,iVar5);
            for (lVar21 = 0; lVar21 < (int)*puVar18; lVar21 = lVar21 + 1) {
              iVar14 = Abc_Lit2Var(puVar18[lVar21 + 1]);
              iVar6 = Abc_LitIsCompl(puVar18[lVar21 + 1]);
              iVar14 = Abc_Var2Lit(iVar14 + (iVar2 - iVar1) + 1,iVar6);
              Vec_IntPush((Vec_Int_t *)p_01,iVar14);
            }
            psVar15 = s;
            iVar6 = sat_solver_solve(s,*(lit **)&p_01->qhead,*(lit **)&p_01->qhead + p_01->cap,0,0,0
                                     ,0);
            iVar14 = (int)psVar15;
            if (iVar6 != -1) {
              if (iVar6 == 0) goto LAB_004dc112;
              if (iVar6 != 1) {
                __assert_fail("status == l_True",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                              ,0x375,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
              }
              goto LAB_004dbede;
            }
          }
          puVar18 = puVar18 + (long)(int)*puVar18 + 1;
        }
        if (fVerbose != 0) {
          Abc_Print((int)psVar15,"Removing clause %d.\n",uVar20);
        }
        if (iVar19 <= (int)i) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar18 = (uint *)((long)__s + (uVar20 >> 5) * 4);
        *puVar18 = *puVar18 | 1 << ((byte)uVar20 & 0x1f);
        local_98 = local_98 + 1;
      }
    }
LAB_004dbede:
    uVar20 = (ulong)(i + 1);
    uVar7 = *puVar3;
  }
LAB_004dc112:
  if (local_98 == 0) {
    pStr = "Invariant minimization did not change the invariant.  ";
    Abc_Print(iVar14,"Invariant minimization did not change the invariant.  ");
  }
  else {
    pStr = "Invariant minimization reduced %d clauses (out of %d).  ";
    Abc_Print(iVar14,"Invariant minimization reduced %d clauses (out of %d).  ",(ulong)local_98,
              (ulong)uVar9);
  }
  aVar11 = Abc_Clock();
  Abc_PrintTime((int)aVar11 - (int)aVar10,pStr,time);
  iVar14 = 0;
  if ((int)local_98 < 1 || (int)i < (int)uVar7) {
    p_03 = (Vec_Int_t *)0x0;
  }
  else {
    p_03 = Vec_IntAlloc(1000);
    Vec_IntPush(p_03,uVar9 - local_98);
    for (; iVar14 < (int)*puVar3; iVar14 = iVar14 + 1) {
      iVar19 = Vec_BitEntry((Vec_Bit_t *)p_02,iVar14);
      if (iVar19 == 0) {
        for (lVar21 = 0; uVar9 = *puVar13, lVar21 <= (int)uVar9; lVar21 = lVar21 + 1) {
          Vec_IntPush(p_03,puVar13[lVar21]);
        }
      }
      else {
        uVar9 = *puVar13;
      }
      puVar13 = puVar13 + (long)(int)uVar9 + 1;
    }
    iVar14 = Vec_IntEntryLast(vInv);
    Vec_IntPush(p_03,iVar14);
  }
  Cnf_DataFree(p_00);
  sat_solver_delete(s);
  free(__s);
  free(p_02);
  Vec_IntFree((Vec_Int_t *)p_01);
  return p_03;
}

Assistant:

Vec_Int_t * Pdr_InvMinimize( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    abctime clk = Abc_Clock();
    int n, i, k, status, nLits, fFailed = 0, fCannot = 0, nRemoved = 0; 
    Vec_Int_t * vRes = NULL;
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    int * pCube, * pList = Vec_IntArray(vInv), nCubes = pList[0];
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    Vec_Bit_t * vRemoved = Vec_BitStart( nCubes );
    int iFoVarBeg = pCnf->nVars - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    int iAuxVarBeg = sat_solver_nvars(pSat);
    // allocate auxiliary variables
    assert( sat_solver_nvars(pSat) == pCnf->nVars );
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + nCubes );
    // add clauses
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(iAuxVarBeg + i, 1) ); // neg aux literal
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through clauses 
    Pdr_ForEachCube( pList, pCube, i )
    {
        if ( Vec_BitEntry(vRemoved, i) )
            continue;
        // collect aux literals for remaining clauses
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && !Vec_BitEntry(vRemoved, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(iAuxVarBeg + k, 0) ); // pos aux literal
        nLits = Vec_IntSize( vLits );
        // check if the property still holds
        if ( fCheckProperty )
        {
            for ( k = 0; k < Gia_ManPoNum(p); k++ )
            {
                Vec_IntShrink( vLits, nLits );
                Vec_IntPush( vLits, Abc_Var2Lit(1+k, 0) );
                status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
                if ( status == l_Undef ) // timeout
                {
                    fFailed = 1;
                    break;
                }
                if ( status == l_True ) // sat - property fails
                    break;
                assert( status == l_False ); // unsat - property holds
            }
            if ( fFailed )
                break;
            if ( k < Gia_ManPoNum(p) )
                continue;
        }
        // check other clauses
        fCannot = 0;
        Pdr_ForEachCube( pList, pCube, n )
        {
            if ( Vec_BitEntry(vRemoved, n) || n == i )
                continue;
            // collect cube
            Vec_IntShrink( vLits, nLits );
            for ( k = 0; k < pCube[0]; k++ )
               Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
            // check if this cube intersects with the complement of other cubes in the solver
            // if it does not intersect, then it is redundant and can be skipped
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
            {
                fFailed = 1;
                break;
            }
            if ( status == l_False ) // unsat -- correct
                continue;
            assert( status == l_True );
            // cannot remove
            fCannot = 1;
            break;
        }
        if ( fFailed )
            break;
        if ( fCannot )
            continue;
        if ( fVerbose )
        Abc_Print(1, "Removing clause %d.\n", i );
        Vec_BitWriteEntry( vRemoved, i, 1 );
        nRemoved++;
    }
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d clauses (out of %d).  ", nRemoved, nCubes );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // cleanup cover
    if ( !fFailed && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, nCubes-nRemoved );
        Pdr_ForEachCube( pList, pCube, i )
            if ( !Vec_BitEntry(vRemoved, i) )
                for ( k = 0; k <= pCube[0]; k++ )
                    Vec_IntPush( vRes, pCube[k] );
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_BitFree( vRemoved );
    Vec_IntFree( vLits );
    return vRes;
}